

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.cpp
# Opt level: O0

void __thiscall
MathML::AST::ConstantExpression::arithmeticalBinaryOperation
          (ConstantExpression *this,ConstantExpression *result,ConstantExpression *rhs,Operator op)

{
  int iVar1;
  long *in_RDX;
  long *in_RSI;
  Error *in_RDI;
  double val2_2;
  double val1_2;
  long val2_1;
  long val1_1;
  long val2;
  long val1;
  Error error;
  ErrorCode errorCode;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  allocator<char> local_71;
  string local_70 [32];
  undefined1 local_50 [56];
  long *local_18;
  long *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar1 = (*in_RDI->_vptr_Error[9])();
  if ((iVar1 == 0) || (iVar1 = (**(code **)(*local_18 + 0x48))(), iVar1 == 0)) {
    if (*(long *)&in_RDI[1].mErrorCode != 0) {
      errorCode = (ErrorCode)((ulong)&local_71 >> 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      Error::Error(in_RDI,errorCode,(String *)0xc8ee5b);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator(&local_71);
      (**(code **)(**(long **)&in_RDI[1].mErrorCode + 0x10))
                (*(long **)&in_RDI[1].mErrorCode,local_50);
      Error::~Error((Error *)0xc8ee94);
    }
    (**(code **)(*local_10 + 0x30))(0);
  }
  else {
    iVar1 = (*in_RDI->_vptr_Error[9])();
    if (((iVar1 == 1) && (iVar1 = (**(code **)(*local_18 + 0x48))(), iVar1 == 2)) ||
       ((iVar1 = (*in_RDI->_vptr_Error[9])(), iVar1 == 2 &&
        (iVar1 = (**(code **)(*local_18 + 0x48))(), iVar1 == 1)))) {
      (*in_RDI->_vptr_Error[0xb])();
      (**(code **)(*local_18 + 0x58))();
      arithmeticalBinaryOperation<long>
                ((ConstantExpression *)val2,(ConstantExpression *)val1_1,(long *)val2_1,
                 (long *)val1_2,val2_2._4_4_);
    }
    else {
      iVar1 = (*in_RDI->_vptr_Error[9])();
      if ((iVar1 == 2) && (iVar1 = (**(code **)(*local_18 + 0x48))(), iVar1 == 2)) {
        (*in_RDI->_vptr_Error[0xb])();
        (**(code **)(*local_18 + 0x58))();
        arithmeticalBinaryOperation<long>
                  ((ConstantExpression *)val2,(ConstantExpression *)val1_1,(long *)val2_1,
                   (long *)val1_2,val2_2._4_4_);
      }
      else {
        (*in_RDI->_vptr_Error[10])();
        (**(code **)(*local_18 + 0x50))();
        arithmeticalBinaryOperation<double>
                  ((ConstantExpression *)val2,(ConstantExpression *)val1_1,(double *)val2_1,
                   (double *)val1_2,val2_2._4_4_);
      }
    }
  }
  return;
}

Assistant:

void ConstantExpression::arithmeticalBinaryOperation( ConstantExpression& result, const ConstantExpression& rhs, AST::ArithmeticExpression::Operator op ) const
        {
            if ( this->getType() == SCALAR_INVALID || rhs.getType() == SCALAR_INVALID )
            {
                if ( mErrorHandler )
                {
                    Error error( Error::ERR_INVALIDPARAMS, "uninitilized operand(s)" );
                    mErrorHandler->handleError( &error );
                }
                result.setValue( 0. );
                return;
            }

            else if ( (this->getType() == SCALAR_BOOL && rhs.getType() == SCALAR_LONG) || (this->getType() == SCALAR_LONG && rhs.getType() == SCALAR_BOOL) )
            {				
				long val1 = this->getLongValue();
				long val2 = rhs.getLongValue();
				arithmeticalBinaryOperation( result, val1, val2, op );
            }

            else if ( this->getType() == SCALAR_LONG && rhs.getType() == SCALAR_LONG )
            {
                long val1 = this->getLongValue();
                long val2 = rhs.getLongValue();
                arithmeticalBinaryOperation( result, val1, val2, op );
            }

            else
            {
                double val1 = this->getDoubleValue();
                double val2 = rhs.getDoubleValue();
                arithmeticalBinaryOperation( result, val1, val2, op );
            }
        }